

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::CreateLocalGenerators(cmGlobalGenerator *this)

{
  pointer *pppcVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  iterator __position;
  int iVar4;
  undefined4 extraout_var;
  pointer ppcVar5;
  pointer ppcVar6;
  cmLocalGenerator *lg;
  cmLocalGenerator *local_30;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalGenerator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->LocalGeneratorSearchIndex)._M_h);
  ppcVar2 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar6 = (this->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppcVar6 != ppcVar2; ppcVar6 = ppcVar6 + 1) {
    if (*ppcVar6 != (cmLocalGenerator *)0x0) {
      (*(*ppcVar6)->_vptr_cmLocalGenerator[1])();
    }
  }
  ppcVar6 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar6) {
    (this->LocalGenerators).
    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar6;
  }
  std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::reserve
            (&this->LocalGenerators,
             (long)(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppcVar5 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppcVar3 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar5 != ppcVar3) {
    do {
      iVar4 = (*this->_vptr_cmGlobalGenerator[2])(this,*ppcVar5);
      local_30 = (cmLocalGenerator *)CONCAT44(extraout_var,iVar4);
      __position._M_current =
           (this->LocalGenerators).
           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->LocalGenerators).
          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::
        _M_realloc_insert<cmLocalGenerator*const&>
                  ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
                   &this->LocalGenerators,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        pppcVar1 = &(this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      IndexLocalGenerator(this,local_30);
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar3);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CreateLocalGenerators()
{
  this->LocalGeneratorSearchIndex.clear();
  cmDeleteAll(this->LocalGenerators);
  this->LocalGenerators.clear();
  this->LocalGenerators.reserve(this->Makefiles.size());
  for (cmMakefile* m : this->Makefiles) {
    cmLocalGenerator* lg = this->CreateLocalGenerator(m);
    this->LocalGenerators.push_back(lg);
    this->IndexLocalGenerator(lg);
  }
}